

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_mus.cpp
# Opt level: O1

bool midi_processor::process_mus
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  const_iterator cVar1;
  byte bVar2;
  pointer puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  event_type p_type;
  uint uVar7;
  uint uVar8;
  size_t p_data_count;
  ulong uVar9;
  const_iterator end;
  bool bVar10;
  uint8_t buffer [4];
  const_iterator it;
  midi_track track;
  uint8_t velocity_levels [16];
  byte local_b3;
  byte local_b2;
  const_iterator local_b0;
  midi_track local_a8;
  midi_event local_88;
  byte local_48 [24];
  
  puVar3 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)*(ushort *)(puVar3 + 4);
  uVar9 = (ulong)*(ushort *)(puVar3 + 6);
  midi_container::initialize(p_out,0,0x59);
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  midi_event::midi_event(&local_88,0,extended,0,mus_default_tempo,5);
  midi_track::add_event(&local_a8,&local_88);
  if (local_88.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  midi_event::midi_event(&local_88,0,extended,0,end_of_track,2);
  midi_track::add_event(&local_a8,&local_88);
  if (local_88.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  midi_container::add_track(p_out,&local_a8);
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_a8.m_events);
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[8] = 0;
  local_48[9] = 0;
  local_48[10] = 0;
  local_48[0xb] = 0;
  local_48[0xc] = 0;
  local_48[0xd] = 0;
  local_48[0xe] = 0;
  local_48[0xf] = 0;
  puVar3 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  bVar10 = false;
  if ((uVar9 < uVar5) && (bVar10 = false, uVar6 + uVar9 <= uVar5)) {
    local_b0._M_current = puVar3 + uVar9;
    end._M_current = local_b0._M_current + uVar6;
    uVar7 = 0;
    do {
      cVar1._M_current = local_b0._M_current;
      if (local_b0._M_current == end._M_current) {
LAB_00110733:
        local_b0._M_current = cVar1._M_current;
        midi_event::midi_event(&local_88,(ulong)uVar7,extended,0,end_of_track,2);
        midi_track::add_event(&local_a8,&local_88);
        if (local_88.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar10 = true;
        midi_container::add_track(p_out,&local_a8);
        goto LAB_00110789;
      }
      cVar1._M_current = local_b0._M_current + 1;
      bVar2 = *local_b0._M_current;
      if (bVar2 == 0x60) goto LAB_00110733;
      uVar8 = bVar2 & 0xf;
      uVar6 = (ulong)((uVar8 + 1) - (uint)((byte)uVar8 < 9));
      if (uVar8 == 0xf) {
        uVar6 = 9;
      }
      switch(bVar2 >> 4 & 7) {
      case 0:
        if (cVar1._M_current != end._M_current) {
          local_b3 = local_b0._M_current[1];
          local_b2 = 0;
          local_b0._M_current = local_b0._M_current + 2;
          goto LAB_001106c0;
        }
        break;
      case 1:
        if (cVar1._M_current == end._M_current) break;
        cVar1._M_current = local_b0._M_current + 2;
        local_b3 = local_b0._M_current[1];
        if ((char)local_b3 < '\0') {
          if (cVar1._M_current == end._M_current) break;
          local_b2 = local_b0._M_current[2];
          local_48[uVar6] = local_b2;
          local_b3 = local_b3 & 0x7f;
          local_b0._M_current = local_b0._M_current + 3;
        }
        else {
          local_b2 = local_48[uVar6];
          local_b0._M_current = cVar1._M_current;
        }
LAB_001106c0:
        p_data_count = 2;
        p_type = note_on;
LAB_001106cb:
        midi_event::midi_event(&local_88,(ulong)uVar7,p_type,(uint)uVar6,&local_b3,p_data_count);
        midi_track::add_event(&local_a8,&local_88);
        if (local_88.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar10 = true;
        if ((char)bVar2 < '\0') {
          iVar4 = decode_delta(&local_b0,end);
          bVar10 = -1 < iVar4;
          if (!bVar10) {
            iVar4 = 0;
          }
          uVar7 = uVar7 + iVar4;
        }
        goto LAB_00110727;
      case 2:
        if (cVar1._M_current != end._M_current) {
          local_b2 = local_b0._M_current[1] >> 1;
          local_b3 = local_b0._M_current[1] << 7;
          p_data_count = 2;
          p_type = pitch_wheel;
          local_b0._M_current = local_b0._M_current + 2;
          goto LAB_001106cb;
        }
        break;
      case 3:
        if (cVar1._M_current != end._M_current) {
          local_b3 = local_b0._M_current[1];
          cVar1._M_current = local_b0._M_current + 2;
          if ((byte)(local_b3 - 10) < 5) {
            local_b3 = ""[local_b3];
            local_b2 = 1;
            local_b0._M_current = local_b0._M_current + 2;
LAB_0011063b:
            p_data_count = 2;
            p_type = control_change;
            goto LAB_001106cb;
          }
        }
        break;
      case 4:
        if (cVar1._M_current != end._M_current) {
          cVar1._M_current = local_b0._M_current + 2;
          local_b3 = local_b0._M_current[1];
          if ((ulong)local_b3 == 0) {
            if (cVar1._M_current != end._M_current) {
              local_b3 = local_b0._M_current[2];
              p_data_count = 1;
              p_type = program_change;
              local_b0._M_current = local_b0._M_current + 3;
              goto LAB_001106cb;
            }
          }
          else if ((local_b3 < 10) && (local_b3 = ""[local_b3], cVar1._M_current != end._M_current))
          {
            local_b2 = local_b0._M_current[2];
            local_b0._M_current = local_b0._M_current + 3;
            goto LAB_0011063b;
          }
        }
      }
      local_b0._M_current = cVar1._M_current;
      bVar10 = false;
LAB_00110727:
    } while (bVar10);
    bVar10 = false;
  }
LAB_00110789:
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_a8.m_events);
  return bVar10;
}

Assistant:

bool midi_processor::process_mus( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint16_t length = p_file[ 4 ] | ( p_file[ 5 ] << 8 );
    uint16_t offset = p_file[ 6 ] | ( p_file[ 7 ] << 8 );

    p_out.initialize( 0, 0x59 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, mus_default_tempo, _countof( mus_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    midi_track track;

    unsigned current_timestamp = 0;

    uint8_t velocity_levels[ 16 ] = { 0 };

    if ( (size_t)offset >= p_file.size() || (size_t)(offset + length) > p_file.size() )
        return false;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + offset, end = p_file.begin() + offset + length;

    uint8_t buffer[ 4 ];

    while ( it != end )
    {
        buffer[ 0 ] = *it++;
        if ( buffer[ 0 ] == 0x60 ) break;

        midi_event::event_type type;

        unsigned bytes_to_write;

        unsigned channel = buffer[ 0 ] & 0x0F;
        if ( channel == 0x0F ) channel = 9;
        else if ( channel >= 9 ) ++channel;

        switch ( buffer[ 0 ] & 0x70 )
        {
        case 0x00:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = 0;
            bytes_to_write = 2;
            break;

        case 0x10:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] & 0x80 )
            {
                if ( it == end ) return false;
                buffer[ 2 ] = *it++;
                velocity_levels[ channel ] = buffer[ 2 ];
                buffer[ 1 ] &= 0x7F;
            }
            else
            {
                buffer[ 2 ] = velocity_levels[ channel ];
            }
            bytes_to_write = 2;
            break;

        case 0x20:
            type = midi_event::pitch_wheel;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = buffer[ 1 ] >> 1;
            buffer[ 1 ] <<= 7;
            bytes_to_write = 2;
            break;

        case 0x30:
            type = midi_event::control_change;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] >= 10 && buffer[ 1 ] <= 14 )
            {
                buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                buffer[ 2 ] = 1;
                bytes_to_write = 2;
            }
            else return false; /*throw exception_io_data( "Unhandled MUS system event" );*/
            break;

        case 0x40:
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] )
            {
                if ( buffer[ 1 ] < 10 )
                {
                    type = midi_event::control_change;
                    buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                    if ( it == end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_to_write = 2;
                }
                else return false; /*throw exception_io_data( "Invalid MUS controller change event" );*/
            }
            else
            {
                type = midi_event::program_change;
                if ( it == end ) return false;
                buffer[ 1 ] = *it++;
                bytes_to_write = 1;
            }
            break;

        default:
            return false; /*throw exception_io_data( "Invalid MUS status code" );*/
        }

        track.add_event( midi_event( current_timestamp, type, channel, buffer + 1, bytes_to_write ) );

        if ( buffer[ 0 ] & 0x80 )
        {
            int delta = decode_delta( it, end );
            if ( delta < 0 ) return false; /*throw exception_io_data( "Invalid MUS delta" );*/
            current_timestamp += delta;
        }
    }

    track.add_event( midi_event( current_timestamp, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );

    p_out.add_track( track );

    return true;
}